

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O0

size_t Potassco::convert_seq<unsigned_int,unsigned_int*>
                 (char *x,size_t maxLen,uint *out,char sep,char **errPos)

{
  int iVar1;
  char *x_00;
  char in_CL;
  int *in_RDX;
  uint *in_RSI;
  char *in_RDI;
  undefined8 *in_R8;
  uint temp;
  size_t b;
  size_t t;
  char *n;
  int in_stack_ffffffffffffffb4;
  char **errPos_00;
  int *local_20;
  uint *local_8;
  
  if (in_RDI == (char *)0x0) {
    local_8 = (uint *)0x0;
  }
  else {
    local_8 = (uint *)0x0;
    x_00 = in_RDI;
    if (*in_RDI == '[') {
      x_00 = in_RDI + 1;
    }
    errPos_00 = (char **)(ulong)(*in_RDI == '[');
    local_20 = in_RDX;
    while ((local_8 != in_RSI &&
           (iVar1 = xconvert(x_00,local_8,errPos_00,in_stack_ffffffffffffffb4), iVar1 != 0))) {
      *local_20 = in_stack_ffffffffffffffb4;
      local_8 = (uint *)((long)local_8 + 1);
      if ((*x_00 == '\0') || ((*x_00 != in_CL || (x_00[1] == '\0')))) break;
      x_00 = x_00 + 1;
      local_20 = local_20 + 1;
    }
    if ((errPos_00 == (char **)0x0) || (*x_00 == ']')) {
      in_RDI = (char *)((long)errPos_00 + (long)x_00);
    }
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = in_RDI;
    }
  }
  return (size_t)local_8;
}

Assistant:

std::size_t convert_seq(const char* x, std::size_t maxLen, OutIt out, char sep, const char** errPos = 0) {
	if (!x) { return 0; }
	const char* n = x;
	std::size_t t = 0;
	std::size_t b = 0;
	if (*n == '[') { ++b; ++n; }
	while (t != maxLen) {
		T temp;
		if (!xconvert(n, temp, &n, sep)) break;
		*out++ = temp;
		++t;
		if (!*n || *n != (char)sep || !n[1]) break;
		n = n+1;
	}
	if (!b || *n == ']') { n += b; }
	else                 { n  = x; }
	if (errPos) *errPos = n;
	return t;
}